

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O3

void armci_msg_group_bcast_scope(int scope,void *buf,int len,int root,ARMCI_Group *group)

{
  int iVar1;
  MPI_Comm poVar2;
  MPI_Comm comm;
  MPI_Group group_sub;
  int root_sub;
  int local_44;
  MPI_Comm local_40;
  undefined8 local_38;
  undefined4 local_2c;
  
  local_44 = root;
  if (scope == 0x151) {
    if (_number_of_procs_per_node < 2) {
      MPI_Bcast(buf,len,&ompi_mpi_byte,root,&ompi_mpi_comm_self);
      return;
    }
    comex_group_comm(ARMCI_Node_group,&local_40);
    MPI_Bcast(buf,len,&ompi_mpi_byte,root,local_40);
  }
  else {
    poVar2 = wc();
    iVar1 = MPI_Comm_group(poVar2,&local_40);
    if (iVar1 != 0) {
      __assert_fail("MPI_SUCCESS == err",
                    "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/message.c"
                    ,0x2e9,"void armci_msg_group_bcast_scope(int, void *, int, int, ARMCI_Group *)")
      ;
    }
    poVar2 = get_comm((ARMCI_Group *)(ulong)(uint)*group);
    iVar1 = MPI_Comm_group(poVar2,&local_38);
    if (iVar1 != 0) {
      __assert_fail("MPI_SUCCESS == err",
                    "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/message.c"
                    ,0x2eb,"void armci_msg_group_bcast_scope(int, void *, int, int, ARMCI_Group *)")
      ;
    }
    MPI_Group_translate_ranks(local_40,1,&local_44,local_38,&local_2c);
    comex_barrier(*group);
    poVar2 = get_comm((ARMCI_Group *)(ulong)(uint)*group);
    iVar1 = MPI_Bcast(buf,len,&ompi_mpi_byte,local_2c,poVar2);
    if (iVar1 != 0) {
      __assert_fail("MPI_SUCCESS == err",
                    "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/message.c"
                    ,0x2f0,"void armci_msg_group_bcast_scope(int, void *, int, int, ARMCI_Group *)")
      ;
    }
  }
  return;
}

Assistant:

void armci_msg_group_bcast_scope(int scope, void *buf, int len, int root, ARMCI_Group *group)
{
    if (SCOPE_NODE == scope) {
      if (_number_of_procs_per_node > 1) {
        MPI_Comm comm;
        comex_group_comm(ARMCI_Node_group, &comm);
        MPI_Bcast(buf, len, MPI_BYTE, root, comm);
      } else {
        MPI_Bcast(buf, len, MPI_BYTE, root, MPI_COMM_SELF);
      }
    }
    else {
        int root_sub;
        int err;
        /* NOTE: this function is passed a root which has been translated back
         * to the world group while the group passed in is the sub
         * communicator group... what a mess */
        MPI_Group group_world;
        MPI_Group group_sub;
        
        err = MPI_Comm_group(wc(), &group_world);
        assert(MPI_SUCCESS == err);
        err = MPI_Comm_group(get_comm(group), &group_sub);
        assert(MPI_SUCCESS == err);
        err = MPI_Group_translate_ranks(group_world, 1, &root,
                group_sub, &root_sub);
        comex_barrier(*group);
        err = MPI_Bcast(buf, len, MPI_BYTE, root_sub, get_comm(group));
        assert(MPI_SUCCESS == err);
    }
}